

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_datetimepicker.cpp
# Opt level: O0

void QtMWidgets::DateTimePicker::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  QDateTime *dt;
  QTime QVar3;
  TimeSpec TVar4;
  time_t tVar5;
  QDate QVar6;
  undefined4 in_register_00000034;
  DateTimePicker *_t_3;
  void *_v_1;
  DateTimePicker *_t_2;
  undefined1 local_68 [8];
  undefined1 local_60 [24];
  undefined1 local_48 [16];
  void *_v;
  DateTimePicker *_t_1;
  int *result;
  DateTimePicker *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (DateTimePicker *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    result = (int *)_o;
    switch(_id) {
    case 0:
      dateTimeChanged((DateTimePicker *)_o,(QDateTime *)_a[1]);
      break;
    case 1:
      timeChanged((DateTimePicker *)_o,(QTime *)_a[1]);
      break;
    case 2:
      dateChanged((DateTimePicker *)_o,(QDate *)_a[1]);
      break;
    case 3:
      setDateTime((DateTimePicker *)_o,(QDateTime *)_a[1]);
      break;
    case 4:
      setDate((DateTimePicker *)_o,(QDate *)_a[1]);
      break;
    case 5:
      setTime((DateTimePicker *)_o,(QTime *)_a[1]);
      break;
    case 6:
      _q_scroll((DateTimePicker *)_o,*_a[1],*_a[2]);
      break;
    case 7:
      _q_scrollAboutToStart((DateTimePicker *)_o);
      break;
    case 8:
      _q_scrollFinished((DateTimePicker *)_o);
    }
  }
  else if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    if (pcVar2 == dateTimeChanged && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *_a[1];
      if (pcVar2 == timeChanged && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *_a[1];
        if (pcVar2 == dateChanged && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
          *puVar1 = 2;
        }
      }
    }
  }
  else if (_c == ReadProperty) {
    local_48._8_8_ = *_a;
    _v = _o;
    switch(_id) {
    case 0:
      dateTime((DateTimePicker *)local_48);
      QDateTime::operator=((QDateTime *)local_48._8_8_,(QDateTime *)local_48);
      QDateTime::~QDateTime((QDateTime *)local_48);
      break;
    case 1:
      QVar6 = date((DateTimePicker *)_o);
      ((DateTimeParser *)local_48._8_8_)->_vptr_DateTimeParser = (_func_int **)QVar6.jd;
      break;
    case 2:
      tVar5 = time((DateTimePicker *)_o,(time_t *)CONCAT44(in_register_00000034,_c));
      *(int *)&((DateTimeParser *)local_48._8_8_)->_vptr_DateTimeParser = (int)tVar5;
      break;
    case 3:
      maximumDateTime((DateTimePicker *)local_60);
      QDateTime::operator=((QDateTime *)local_48._8_8_,(QDateTime *)local_60);
      QDateTime::~QDateTime((QDateTime *)local_60);
      break;
    case 4:
      minimumDateTime((DateTimePicker *)local_68);
      QDateTime::operator=((QDateTime *)local_48._8_8_,(QDateTime *)local_68);
      QDateTime::~QDateTime((QDateTime *)local_68);
      break;
    case 5:
      QVar6 = maximumDate((DateTimePicker *)_o);
      ((DateTimeParser *)local_48._8_8_)->_vptr_DateTimeParser = (_func_int **)QVar6.jd;
      break;
    case 6:
      QVar6 = minimumDate((DateTimePicker *)_o);
      ((DateTimeParser *)local_48._8_8_)->_vptr_DateTimeParser = (_func_int **)QVar6.jd;
      break;
    case 7:
      QVar3 = maximumTime((DateTimePicker *)_o);
      *(int *)&((DateTimeParser *)local_48._8_8_)->_vptr_DateTimeParser = QVar3.mds;
      break;
    case 8:
      QVar3 = minimumTime((DateTimePicker *)_o);
      *(int *)&((DateTimeParser *)local_48._8_8_)->_vptr_DateTimeParser = QVar3.mds;
      break;
    case 9:
      TVar4 = timeSpec((DateTimePicker *)_o);
      *(TimeSpec *)&((DateTimeParser *)local_48._8_8_)->_vptr_DateTimeParser = TVar4;
    }
  }
  else if (_c == WriteProperty) {
    dt = (QDateTime *)*_a;
    switch(_id) {
    case 0:
      setDateTime((DateTimePicker *)_o,dt);
      break;
    case 1:
      setDate((DateTimePicker *)_o,(QDate *)dt);
      break;
    case 2:
      setTime((DateTimePicker *)_o,(QTime *)dt);
      break;
    case 3:
      setMaximumDateTime((DateTimePicker *)_o,dt);
      break;
    case 4:
      setMinimumDateTime((DateTimePicker *)_o,dt);
      break;
    case 5:
      setMaximumDate((DateTimePicker *)_o,(QDate *)dt);
      break;
    case 6:
      setMinimumDate((DateTimePicker *)_o,(QDate *)dt);
      break;
    case 7:
      setMaximumTime((DateTimePicker *)_o,(QTime *)dt);
      break;
    case 8:
      setMinimumTime((DateTimePicker *)_o,(QTime *)dt);
      break;
    case 9:
      setTimeSpec((DateTimePicker *)_o,*(TimeSpec *)dt);
    }
  }
  else if (_c == ResetProperty) {
    switch(_id) {
    case 3:
      clearMaximumDateTime((DateTimePicker *)_o);
      break;
    case 4:
      clearMinimumDateTime((DateTimePicker *)_o);
      break;
    case 5:
      clearMaximumDate((DateTimePicker *)_o);
      break;
    case 6:
      clearMinimumDate((DateTimePicker *)_o);
      break;
    case 7:
      clearMaximumTime((DateTimePicker *)_o);
      break;
    case 8:
      clearMinimumTime((DateTimePicker *)_o);
    }
  }
  return;
}

Assistant:

void QtMWidgets::DateTimePicker::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<DateTimePicker *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->dateTimeChanged((*reinterpret_cast< std::add_pointer_t<QDateTime>>(_a[1]))); break;
        case 1: _t->timeChanged((*reinterpret_cast< std::add_pointer_t<QTime>>(_a[1]))); break;
        case 2: _t->dateChanged((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 3: _t->setDateTime((*reinterpret_cast< std::add_pointer_t<QDateTime>>(_a[1]))); break;
        case 4: _t->setDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 5: _t->setTime((*reinterpret_cast< std::add_pointer_t<QTime>>(_a[1]))); break;
        case 6: _t->_q_scroll((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 7: _t->_q_scrollAboutToStart(); break;
        case 8: _t->_q_scrollFinished(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (DateTimePicker::*)(const QDateTime & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&DateTimePicker::dateTimeChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (DateTimePicker::*)(const QTime & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&DateTimePicker::timeChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (DateTimePicker::*)(const QDate & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&DateTimePicker::dateChanged)) {
                *result = 2;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<DateTimePicker *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QDateTime*>(_v) = _t->dateTime(); break;
        case 1: *reinterpret_cast< QDate*>(_v) = _t->date(); break;
        case 2: *reinterpret_cast< QTime*>(_v) = _t->time(); break;
        case 3: *reinterpret_cast< QDateTime*>(_v) = _t->maximumDateTime(); break;
        case 4: *reinterpret_cast< QDateTime*>(_v) = _t->minimumDateTime(); break;
        case 5: *reinterpret_cast< QDate*>(_v) = _t->maximumDate(); break;
        case 6: *reinterpret_cast< QDate*>(_v) = _t->minimumDate(); break;
        case 7: *reinterpret_cast< QTime*>(_v) = _t->maximumTime(); break;
        case 8: *reinterpret_cast< QTime*>(_v) = _t->minimumTime(); break;
        case 9: *reinterpret_cast< Qt::TimeSpec*>(_v) = _t->timeSpec(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<DateTimePicker *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDateTime(*reinterpret_cast< QDateTime*>(_v)); break;
        case 1: _t->setDate(*reinterpret_cast< QDate*>(_v)); break;
        case 2: _t->setTime(*reinterpret_cast< QTime*>(_v)); break;
        case 3: _t->setMaximumDateTime(*reinterpret_cast< QDateTime*>(_v)); break;
        case 4: _t->setMinimumDateTime(*reinterpret_cast< QDateTime*>(_v)); break;
        case 5: _t->setMaximumDate(*reinterpret_cast< QDate*>(_v)); break;
        case 6: _t->setMinimumDate(*reinterpret_cast< QDate*>(_v)); break;
        case 7: _t->setMaximumTime(*reinterpret_cast< QTime*>(_v)); break;
        case 8: _t->setMinimumTime(*reinterpret_cast< QTime*>(_v)); break;
        case 9: _t->setTimeSpec(*reinterpret_cast< Qt::TimeSpec*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
        auto *_t = static_cast<DateTimePicker *>(_o);
        (void)_t;
        switch (_id) {
        case 3: _t->clearMaximumDateTime(); break;
        case 4: _t->clearMinimumDateTime(); break;
        case 5: _t->clearMaximumDate(); break;
        case 6: _t->clearMinimumDate(); break;
        case 7: _t->clearMaximumTime(); break;
        case 8: _t->clearMinimumTime(); break;
        default: break;
        }
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}